

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O2

void __thiscall QProcessPrivate::commitChannels(QProcessPrivate *this)

{
  int in_EDX;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar1;
  
  iVar1 = (this->stdinChannel).pipe[0];
  if (iVar1 != -1) {
    qt_safe_dup2(iVar1,0,in_EDX);
    in_EDX = extraout_EDX;
  }
  iVar1 = (this->stdoutChannel).pipe[1];
  if (iVar1 != -1) {
    qt_safe_dup2(iVar1,1,in_EDX);
    in_EDX = extraout_EDX_00;
  }
  iVar1 = (this->stderrChannel).pipe[1];
  if (iVar1 == -1) {
    if (this->processChannelMode != '\x01') {
      return;
    }
    iVar1 = 1;
  }
  qt_safe_dup2(iVar1,2,in_EDX);
  return;
}

Assistant:

void QProcessPrivate::commitChannels() const
{
    // copy the stdin socket if asked to (without closing on exec)
    if (stdinChannel.pipe[0] != INVALID_Q_PIPE)
        qt_safe_dup2(stdinChannel.pipe[0], STDIN_FILENO, 0);

    // copy the stdout and stderr if asked to
    if (stdoutChannel.pipe[1] != INVALID_Q_PIPE)
        qt_safe_dup2(stdoutChannel.pipe[1], STDOUT_FILENO, 0);
    if (stderrChannel.pipe[1] != INVALID_Q_PIPE) {
        qt_safe_dup2(stderrChannel.pipe[1], STDERR_FILENO, 0);
    } else {
        // merge stdout and stderr if asked to
        if (processChannelMode == QProcess::MergedChannels)
            qt_safe_dup2(STDOUT_FILENO, STDERR_FILENO, 0);
    }
}